

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  float *pfVar1;
  ushort uVar2;
  ushort uVar3;
  PrimRefMB *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  undefined4 uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  BufferView<embree::Vec3fa> *pBVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  size_t sVar28;
  size_t sVar29;
  size_t *psVar30;
  ulong uVar31;
  long lVar32;
  size_t index;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar48;
  undefined1 auVar42 [12];
  float fVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  undefined1 auVar44 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar45;
  undefined1 auVar46 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar57;
  undefined1 auVar52 [12];
  float fVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  undefined1 auVar54 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar55;
  float fVar58;
  float fVar61;
  float fVar62;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  float __x;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [12];
  float fVar72;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar66;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  float fVar73;
  float fVar74;
  undefined1 auVar69 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar71;
  undefined1 auVar75 [12];
  undefined1 auVar76 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar77;
  undefined1 auVar78 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar79;
  float fVar80;
  float fVar84;
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar83;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar89;
  uint uVar90;
  BBox1f BVar91;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float local_17c;
  ulong local_148;
  unsigned_long local_118;
  size_t local_110;
  size_t local_100;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  uint local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_a8 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  local_b8 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_a8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_b8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_a8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_b8;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar17 = r->_begin;
  local_17c = (__return_storage_ptr__->time_range).lower;
  auVar82 = ZEXT816(0);
  fVar27 = 0.0;
  local_110 = __return_storage_ptr__->num_time_segments;
  sVar29 = __return_storage_ptr__->max_num_time_segments;
  BVar91 = __return_storage_ptr__->max_time_range;
  auVar95._8_8_ = 0;
  auVar95._0_4_ = BVar91.lower;
  auVar95._4_4_ = BVar91.upper;
  aVar60 = local_b8;
  aVar71 = local_a8;
  aVar83 = local_b8;
  aVar89 = local_a8;
  if (uVar17 < r->_end) {
    local_100 = k;
    local_118 = (__return_storage_ptr__->object_range)._end;
    do {
      BVar91 = (this->super_GridMesh).super_Geometry.time_range;
      fVar27 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
      fVar35 = t0t1->upper;
      fVar96 = BVar91.lower;
      fVar49 = BVar91.upper - fVar96;
      fVar34 = floorf(((t0t1->lower - fVar96) / fVar49) * 1.0000002 * fVar27);
      fVar35 = ceilf(((fVar35 - fVar96) / fVar49) * 0.99999976 * fVar27);
      if (uVar17 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar16 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar25 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar21 = *(long *)&(this->super_GridMesh).field_0x68 * uVar17;
        uVar8 = *(uint *)(lVar16 + lVar21);
        if (uVar8 < uVar25) {
          uVar2 = *(ushort *)(lVar16 + 10 + lVar21);
          uVar14 = (ulong)uVar2;
          uVar90 = *(uint *)(lVar16 + 4 + lVar21);
          uVar3 = *(ushort *)(lVar16 + 8 + lVar21);
          if (((uint)uVar3 + uVar90 * (uVar2 - 1) + uVar8) - 1 < uVar25) {
            bVar33 = uVar14 != 0;
            if (bVar33) {
              fVar96 = 0.0;
              if (0.0 <= fVar34) {
                fVar96 = fVar34;
              }
              uVar20 = (uint)fVar96;
              if (fVar27 <= fVar35) {
                fVar35 = fVar27;
              }
              uVar25 = 0;
              do {
                if (uVar3 != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar20 <= (uint)(int)fVar35) {
                      uVar18 = (long)(int)uVar20;
                      psVar30 = &(this->super_GridMesh).vertices.items[(int)uVar20].
                                 super_RawBufferView.stride;
                      do {
                        lVar16 = *psVar30 * (uVar25 * uVar90 + (ulong)uVar8 + uVar31);
                        pfVar1 = (float *)(((RawBufferView *)(psVar30 + -2))->ptr_ofs + lVar16);
                        auVar88._0_4_ =
                             -(uint)(*pfVar1 < (float)DAT_01ff0930 && (float)DAT_01ff0920 < *pfVar1)
                        ;
                        auVar88._4_4_ =
                             -(uint)(pfVar1[1] < DAT_01ff0930._4_4_ &&
                                    DAT_01ff0920._4_4_ < pfVar1[1]);
                        auVar88._8_4_ =
                             -(uint)(pfVar1[2] < DAT_01ff0930._8_4_ &&
                                    DAT_01ff0920._8_4_ < pfVar1[2]);
                        auVar88._12_4_ =
                             -(uint)(pfVar1[3] < DAT_01ff0930._12_4_ &&
                                    DAT_01ff0920._12_4_ < pfVar1[3]);
                        uVar15 = movmskps((int)lVar16,auVar88);
                        if ((~(byte)uVar15 & 7) != 0) {
                          if (bVar33) goto LAB_00ac6473;
                          goto LAB_00ac6451;
                        }
                        uVar18 = uVar18 + 1;
                        psVar30 = psVar30 + 7;
                      } while (uVar18 <= (ulong)(long)(int)fVar35);
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar31 != uVar3);
                }
                uVar25 = uVar25 + 1;
                bVar33 = uVar25 < uVar14;
              } while (uVar25 != uVar14);
            }
LAB_00ac6451:
            lVar16 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
            lVar21 = *(long *)&(this->super_GridMesh).field_0x68 * uVar17;
            if (*(short *)(lVar16 + 10 + lVar21) != 1) {
              local_148 = 0;
              do {
                uVar2 = *(ushort *)(lVar16 + 8 + lVar21);
                uVar90 = (uint)uVar2;
                uVar8 = (uint)local_148;
                if (uVar2 != 1) {
                  sVar28 = sVar29;
                  uVar20 = 0;
                  do {
                    fVar39 = auVar82._0_4_;
                    uVar14 = (ulong)uVar20;
                    uVar25 = uVar14 + 3;
                    fVar27 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
                    fVar35 = (this->super_GridMesh).super_Geometry.time_range.lower;
                    fVar40 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar35;
                    fVar50 = (t0t1->lower - fVar35) / fVar40;
                    fVar40 = (t0t1->upper - fVar35) / fVar40;
                    __x = fVar27 * fVar40;
                    fVar36 = floorf(fVar27 * fVar50);
                    fVar37 = ceilf(__x);
                    fVar35 = (float)DAT_01feb9f0;
                    fVar34 = DAT_01feb9f0._4_4_;
                    fVar96 = DAT_01feb9f0._8_4_;
                    fVar49 = DAT_01feb9f0._12_4_;
                    iVar12 = (int)fVar36;
                    if (fVar36 <= 0.0) {
                      fVar36 = 0.0;
                    }
                    iVar9 = (int)fVar36;
                    if (iVar12 < 0) {
                      iVar12 = -1;
                    }
                    iVar7 = (int)fVar27 + 1;
                    if ((int)fVar37 < (int)fVar27 + 1) {
                      iVar7 = (int)fVar37;
                    }
                    uVar2 = *(ushort *)(lVar16 + 10 + lVar21);
                    uVar18 = (ulong)uVar2;
                    uVar31 = uVar18;
                    if (local_148 + 3 < uVar18) {
                      uVar31 = local_148 + 3;
                    }
                    uVar11 = (ulong)uVar90;
                    uVar19 = sVar28;
                    aVar43 = _DAT_01feb9f0;
                    aVar59 = _DAT_01feba00;
                    if (local_148 < uVar18) {
                      pBVar23 = (this->super_GridMesh).vertices.items + iVar9;
                      uVar24 = uVar11;
                      if (uVar25 < uVar11) {
                        uVar24 = uVar25;
                      }
                      bVar33 = true;
                      uVar26 = local_148;
                      aVar53 = _DAT_01feba00;
                      aVar66 = _DAT_01feb9f0;
                      do {
                        if (uVar20 < uVar90) {
                          sVar29 = (pBVar23->super_RawBufferView).stride;
                          pauVar22 = (undefined1 (*) [16])
                                     ((pBVar23->super_RawBufferView).ptr_ofs +
                                     (*(uint *)(lVar16 + lVar21) + uVar14 +
                                     *(uint *)(lVar16 + 4 + lVar21) * uVar26) * sVar29);
                          lVar32 = uVar24 - uVar14;
                          do {
                            auVar82 = *pauVar22;
                            auVar76._0_4_ =
                                 -(uint)(auVar82._0_4_ < 1.844e+18 && -1.844e+18 < auVar82._0_4_);
                            auVar76._4_4_ =
                                 -(uint)(auVar82._4_4_ < 1.844e+18 && -1.844e+18 < auVar82._4_4_);
                            auVar76._8_4_ =
                                 -(uint)(auVar82._8_4_ < 1.844e+18 && -1.844e+18 < auVar82._8_4_);
                            auVar76._12_4_ =
                                 -(uint)(auVar82._12_4_ < 1.844e+18 && -1.844e+18 < auVar82._12_4_);
                            uVar15 = movmskps((int)uVar19,auVar76);
                            uVar19 = (ulong)CONCAT31((int3)((uint)uVar15 >> 8),~(byte)uVar15);
                            if ((~(byte)uVar15 & 7) != 0) {
                              aVar43 = _DAT_01feb9f0;
                              aVar59 = _DAT_01feba00;
                              if (!bVar33) {
                                aVar43 = aVar66;
                                aVar59 = aVar53;
                              }
                              goto LAB_00ac6705;
                            }
                            aVar66.m128 = (__m128)minps(aVar66.m128,auVar82);
                            aVar53.m128 = (__m128)maxps(aVar53.m128,auVar82);
                            pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar29);
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                        uVar26 = uVar26 + 1;
                        bVar33 = uVar26 < uVar31;
                        aVar43 = aVar66;
                        aVar59 = aVar53;
                      } while (uVar26 != uVar31);
                    }
LAB_00ac6705:
                    if (fVar27 <= fVar37) {
                      fVar37 = fVar27;
                    }
                    iVar10 = (int)fVar37;
                    aVar53 = _DAT_01feb9f0;
                    aVar66 = _DAT_01feba00;
                    if (uVar8 < uVar2) {
                      pBVar23 = (this->super_GridMesh).vertices.items + iVar10;
                      uVar24 = uVar11;
                      if (uVar25 < uVar11) {
                        uVar24 = uVar25;
                      }
                      bVar33 = true;
                      uVar26 = local_148;
                      aVar67 = _DAT_01feba00;
                      aVar77 = _DAT_01feb9f0;
                      do {
                        if (uVar20 < uVar90) {
                          sVar29 = (pBVar23->super_RawBufferView).stride;
                          pauVar22 = (undefined1 (*) [16])
                                     ((pBVar23->super_RawBufferView).ptr_ofs +
                                     (*(uint *)(lVar16 + lVar21) + uVar14 +
                                     *(uint *)(lVar16 + 4 + lVar21) * uVar26) * sVar29);
                          lVar32 = uVar24 - uVar14;
                          do {
                            auVar82 = *pauVar22;
                            auVar86._0_4_ =
                                 -(uint)(auVar82._0_4_ < 1.844e+18 && -1.844e+18 < auVar82._0_4_);
                            auVar86._4_4_ =
                                 -(uint)(auVar82._4_4_ < 1.844e+18 && -1.844e+18 < auVar82._4_4_);
                            auVar86._8_4_ =
                                 -(uint)(auVar82._8_4_ < 1.844e+18 && -1.844e+18 < auVar82._8_4_);
                            auVar86._12_4_ =
                                 -(uint)(auVar82._12_4_ < 1.844e+18 && -1.844e+18 < auVar82._12_4_);
                            uVar15 = movmskps((int)uVar19,auVar86);
                            uVar19 = (ulong)CONCAT31((int3)((uint)uVar15 >> 8),~(byte)uVar15);
                            if ((~(byte)uVar15 & 7) != 0) {
                              aVar53 = _DAT_01feb9f0;
                              aVar66 = _DAT_01feba00;
                              if (!bVar33) {
                                aVar53 = aVar77;
                                aVar66 = aVar67;
                              }
                              goto LAB_00ac67e2;
                            }
                            aVar77.m128 = (__m128)minps(aVar77.m128,auVar82);
                            aVar67.m128 = (__m128)maxps(aVar67.m128,auVar82);
                            pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar29);
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                        uVar26 = uVar26 + 1;
                        bVar33 = uVar26 < uVar31;
                        aVar53 = aVar77;
                        aVar66 = aVar67;
                      } while (uVar26 != uVar31);
                    }
LAB_00ac67e2:
                    fVar36 = fVar27 * fVar50 - fVar36;
                    fVar51 = aVar53.m128[0];
                    fVar41 = aVar43.m128[0];
                    fVar80 = aVar66.m128[0];
                    fVar84 = aVar66.m128[1];
                    fVar85 = aVar66.m128[2];
                    fVar58 = aVar59.m128[0];
                    fVar61 = aVar59.m128[1];
                    fVar62 = aVar59.m128[2];
                    fVar47 = aVar43.m128[1];
                    fVar48 = aVar43.m128[2];
                    fVar56 = aVar53.m128[1];
                    fVar57 = aVar53.m128[2];
                    if (iVar7 - iVar12 == 1) {
                      if (fVar36 <= 0.0) {
                        fVar36 = 0.0;
                      }
                      fVar35 = 1.0 - fVar36;
                      auVar42._4_4_ = fVar35 * fVar47 + fVar36 * fVar56;
                      auVar42._0_4_ = fVar35 * fVar41 + fVar36 * fVar51;
                      auVar65._0_4_ = fVar35 * fVar58 + fVar36 * fVar80;
                      auVar65._4_4_ = fVar35 * fVar61 + fVar36 * fVar84;
                      auVar65._8_4_ = fVar35 * fVar62 + fVar36 * fVar85;
                      fVar27 = fVar37 - __x;
                      if (fVar37 - __x <= 0.0) {
                        fVar27 = 0.0;
                      }
                      fVar34 = 1.0 - fVar27;
                      auVar52._0_4_ = fVar51 * fVar34 + fVar41 * fVar27;
                      auVar52._4_4_ = fVar56 * fVar34 + fVar47 * fVar27;
                      auVar52._8_4_ = fVar57 * fVar34 + fVar48 * fVar27;
                      auVar75._0_4_ = fVar34 * fVar80 + fVar27 * fVar58;
                      auVar75._4_4_ = fVar34 * fVar84 + fVar27 * fVar61;
                      auVar75._8_4_ = fVar34 * fVar85 + fVar27 * fVar62;
                      auVar42._8_4_ = fVar35 * fVar48 + fVar36 * fVar57;
                    }
                    else {
                      aVar67 = _DAT_01feb9f0;
                      aVar77 = _DAT_01feba00;
                      if (uVar8 < uVar2) {
                        pBVar23 = (this->super_GridMesh).vertices.items;
                        uVar24 = uVar11;
                        if (uVar25 < uVar11) {
                          uVar24 = uVar25;
                        }
                        bVar33 = true;
                        uVar26 = local_148;
                        aVar68 = _DAT_01feba00;
                        aVar92 = _DAT_01feb9f0;
                        do {
                          if (uVar20 < uVar90) {
                            sVar29 = pBVar23[(long)iVar9 + 1].super_RawBufferView.stride;
                            pauVar22 = (undefined1 (*) [16])
                                       (pBVar23[(long)iVar9 + 1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar16 + lVar21) + uVar14 +
                                       *(uint *)(lVar16 + 4 + lVar21) * uVar26) * sVar29);
                            lVar32 = uVar24 - uVar14;
                            do {
                              auVar82 = *pauVar22;
                              auVar5._4_4_ = -(uint)(auVar82._4_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar82._4_4_);
                              auVar5._0_4_ = -(uint)(auVar82._0_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar82._0_4_);
                              auVar5._8_4_ = -(uint)(auVar82._8_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar82._8_4_);
                              auVar5._12_4_ =
                                   -(uint)(auVar82._12_4_ < 1.844e+18 && -1.844e+18 < auVar82._12_4_
                                          );
                              uVar15 = movmskps((int)uVar19,auVar5);
                              uVar19 = (ulong)CONCAT31((int3)((uint)uVar15 >> 8),~(byte)uVar15);
                              if ((~(byte)uVar15 & 7) != 0) {
                                aVar67 = _DAT_01feb9f0;
                                aVar77 = _DAT_01feba00;
                                if (!bVar33) {
                                  aVar67 = aVar92;
                                  aVar77 = aVar68;
                                }
                                goto LAB_00ac6930;
                              }
                              aVar92.m128 = (__m128)minps(aVar92.m128,auVar82);
                              aVar68.m128 = (__m128)maxps(aVar68.m128,auVar82);
                              pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar29);
                              lVar32 = lVar32 + -1;
                            } while (lVar32 != 0);
                          }
                          uVar26 = uVar26 + 1;
                          bVar33 = uVar26 < uVar31;
                          aVar67 = aVar92;
                          aVar77 = aVar68;
                        } while (uVar26 != uVar31);
                      }
LAB_00ac6930:
                      fVar63 = -INFINITY;
                      fVar72 = -INFINITY;
                      fVar73 = -INFINITY;
                      fVar74 = -INFINITY;
                      if (uVar8 < uVar2) {
                        pBVar23 = (this->super_GridMesh).vertices.items;
                        uVar24 = uVar11;
                        if (uVar25 < uVar11) {
                          uVar24 = uVar25;
                        }
                        bVar33 = true;
                        uVar26 = local_148;
                        aVar68 = _DAT_01feba00;
                        aVar92 = _DAT_01feb9f0;
                        do {
                          if (uVar20 < uVar90) {
                            sVar29 = pBVar23[(long)iVar10 + -1].super_RawBufferView.stride;
                            pauVar22 = (undefined1 (*) [16])
                                       (pBVar23[(long)iVar10 + -1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar16 + lVar21) + uVar14 +
                                       *(uint *)(lVar16 + 4 + lVar21) * uVar26) * sVar29);
                            lVar32 = uVar24 - uVar14;
                            do {
                              auVar82 = *pauVar22;
                              auVar6._4_4_ = -(uint)(auVar82._4_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar82._4_4_);
                              auVar6._0_4_ = -(uint)(auVar82._0_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar82._0_4_);
                              auVar6._8_4_ = -(uint)(auVar82._8_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar82._8_4_);
                              auVar6._12_4_ =
                                   -(uint)(auVar82._12_4_ < 1.844e+18 && -1.844e+18 < auVar82._12_4_
                                          );
                              uVar15 = movmskps((int)uVar19,auVar6);
                              uVar19 = (ulong)CONCAT31((int3)((uint)uVar15 >> 8),~(byte)uVar15);
                              if ((~(byte)uVar15 & 7) != 0) {
                                fVar35 = INFINITY;
                                fVar34 = INFINITY;
                                fVar96 = INFINITY;
                                fVar49 = INFINITY;
                                fVar63 = -INFINITY;
                                fVar72 = -INFINITY;
                                fVar73 = -INFINITY;
                                fVar74 = -INFINITY;
                                if (!bVar33) {
                                  fVar35 = aVar92.m128[0];
                                  fVar34 = aVar92.m128[1];
                                  fVar96 = aVar92.m128[2];
                                  fVar49 = aVar92.m128[3];
                                  fVar63 = aVar68.m128[0];
                                  fVar72 = aVar68.m128[1];
                                  fVar73 = aVar68.m128[2];
                                  fVar74 = aVar68.m128[3];
                                }
                                goto LAB_00ac69ff;
                              }
                              aVar92.m128 = (__m128)minps(aVar92.m128,auVar82);
                              aVar68.m128 = (__m128)maxps(aVar68.m128,auVar82);
                              pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar29);
                              lVar32 = lVar32 + -1;
                            } while (lVar32 != 0);
                          }
                          uVar26 = uVar26 + 1;
                          fVar35 = aVar92.m128[0];
                          fVar34 = aVar92.m128[1];
                          fVar96 = aVar92.m128[2];
                          fVar49 = aVar92.m128[3];
                          fVar63 = aVar68.m128[0];
                          fVar72 = aVar68.m128[1];
                          fVar73 = aVar68.m128[2];
                          fVar74 = aVar68.m128[3];
                          bVar33 = uVar26 < uVar31;
                        } while (uVar26 != uVar31);
                      }
LAB_00ac69ff:
                      if (fVar36 <= 0.0) {
                        fVar36 = 0.0;
                      }
                      fVar64 = 1.0 - fVar36;
                      auVar42._0_4_ = fVar41 * fVar64 + aVar67.m128[0] * fVar36;
                      auVar42._4_4_ = fVar47 * fVar64 + aVar67.m128[1] * fVar36;
                      auVar42._8_4_ = fVar48 * fVar64 + aVar67.m128[2] * fVar36;
                      auVar44._12_4_ = aVar43.m128[3] * fVar64 + aVar67.m128[3] * fVar36;
                      auVar44._0_12_ = auVar42;
                      auVar65._0_4_ = fVar64 * fVar58 + fVar36 * aVar77.m128[0];
                      auVar65._4_4_ = fVar64 * fVar61 + fVar36 * aVar77.m128[1];
                      auVar65._8_4_ = fVar64 * fVar62 + fVar36 * aVar77.m128[2];
                      auVar69._12_4_ = fVar64 * aVar59.m128[3] + fVar36 * aVar77.m128[3];
                      auVar69._0_12_ = auVar65;
                      fVar36 = fVar37 - __x;
                      if (fVar37 - __x <= 0.0) {
                        fVar36 = 0.0;
                      }
                      fVar37 = 1.0 - fVar36;
                      auVar52._0_4_ = fVar51 * fVar37 + fVar35 * fVar36;
                      auVar52._4_4_ = fVar56 * fVar37 + fVar34 * fVar36;
                      auVar52._8_4_ = fVar57 * fVar37 + fVar96 * fVar36;
                      auVar54._12_4_ = aVar53.m128[3] * fVar37 + fVar49 * fVar36;
                      auVar54._0_12_ = auVar52;
                      auVar75._0_4_ = fVar37 * fVar80 + fVar36 * fVar63;
                      auVar75._4_4_ = fVar37 * fVar84 + fVar36 * fVar72;
                      auVar75._8_4_ = fVar37 * fVar85 + fVar36 * fVar73;
                      auVar78._12_4_ = fVar37 * aVar66.m128[3] + fVar36 * fVar74;
                      auVar78._0_12_ = auVar75;
                      if ((int)(iVar12 + 1U) < iVar7) {
                        uVar19 = (ulong)(iVar12 + 1U);
                        if (uVar11 <= uVar25) {
                          uVar25 = uVar11;
                        }
                        do {
                          aVar43 = _DAT_01feb9f0;
                          aVar59 = _DAT_01feba00;
                          if (uVar8 < uVar2) {
                            pBVar23 = (this->super_GridMesh).vertices.items + uVar19;
                            bVar33 = true;
                            uVar11 = uVar18;
                            uVar24 = local_148;
                            aVar53 = _DAT_01feba00;
                            aVar66 = _DAT_01feb9f0;
                            do {
                              if (uVar20 < uVar90) {
                                sVar29 = (pBVar23->super_RawBufferView).stride;
                                pauVar22 = (undefined1 (*) [16])
                                           ((pBVar23->super_RawBufferView).ptr_ofs +
                                           (*(uint *)(lVar16 + lVar21) + uVar14 +
                                           *(uint *)(lVar16 + 4 + lVar21) * uVar24) * sVar29);
                                lVar32 = uVar25 - uVar14;
                                do {
                                  auVar82 = *pauVar22;
                                  auVar93._0_4_ =
                                       -(uint)(auVar82._0_4_ < 1.844e+18 &&
                                              -1.844e+18 < auVar82._0_4_);
                                  auVar93._4_4_ =
                                       -(uint)(auVar82._4_4_ < 1.844e+18 &&
                                              -1.844e+18 < auVar82._4_4_);
                                  auVar93._8_4_ =
                                       -(uint)(auVar82._8_4_ < 1.844e+18 &&
                                              -1.844e+18 < auVar82._8_4_);
                                  auVar93._12_4_ =
                                       -(uint)(auVar82._12_4_ < 1.844e+18 &&
                                              -1.844e+18 < auVar82._12_4_);
                                  uVar15 = movmskps((int)uVar11,auVar93);
                                  uVar11 = (ulong)CONCAT31((int3)((uint)uVar15 >> 8),~(byte)uVar15);
                                  if ((~(byte)uVar15 & 7) != 0) {
                                    aVar43 = _DAT_01feb9f0;
                                    aVar59 = _DAT_01feba00;
                                    if (!bVar33) {
                                      aVar43 = aVar66;
                                      aVar59 = aVar53;
                                    }
                                    goto LAB_00ac6b5d;
                                  }
                                  aVar66.m128 = (__m128)minps(aVar66.m128,auVar82);
                                  aVar53.m128 = (__m128)maxps(aVar53.m128,auVar82);
                                  pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar29);
                                  lVar32 = lVar32 + -1;
                                } while (lVar32 != 0);
                              }
                              uVar24 = uVar24 + 1;
                              bVar33 = uVar24 < uVar31;
                              aVar43 = aVar66;
                              aVar59 = aVar53;
                            } while (uVar24 != uVar31);
                          }
LAB_00ac6b5d:
                          fVar35 = ((float)(int)uVar19 / fVar27 - fVar50) / (fVar40 - fVar50);
                          fVar34 = 1.0 - fVar35;
                          auVar81._0_4_ =
                               aVar43.m128[0] - (auVar44._0_4_ * fVar34 + auVar54._0_4_ * fVar35);
                          auVar81._4_4_ =
                               aVar43.m128[1] - (auVar44._4_4_ * fVar34 + auVar54._4_4_ * fVar35);
                          auVar81._8_4_ =
                               aVar43.m128[2] - (auVar44._8_4_ * fVar34 + auVar54._8_4_ * fVar35);
                          auVar81._12_4_ =
                               aVar43.m128[3] - (auVar44._12_4_ * fVar34 + auVar54._12_4_ * fVar35);
                          auVar87._0_4_ =
                               aVar59.m128[0] - (fVar34 * auVar69._0_4_ + fVar35 * auVar78._0_4_);
                          auVar87._4_4_ =
                               aVar59.m128[1] - (fVar34 * auVar69._4_4_ + fVar35 * auVar78._4_4_);
                          auVar87._8_4_ =
                               aVar59.m128[2] - (fVar34 * auVar69._8_4_ + fVar35 * auVar78._8_4_);
                          auVar87._12_4_ =
                               aVar59.m128[3] - (fVar34 * auVar69._12_4_ + fVar35 * auVar78._12_4_);
                          auVar82 = minps(auVar81,ZEXT816(0));
                          auVar88 = maxps(auVar87,ZEXT816(0));
                          auVar42._0_4_ = auVar44._0_4_ + auVar82._0_4_;
                          auVar42._4_4_ = auVar44._4_4_ + auVar82._4_4_;
                          auVar42._8_4_ = auVar44._8_4_ + auVar82._8_4_;
                          auVar44._12_4_ = auVar44._12_4_ + auVar82._12_4_;
                          auVar44._0_12_ = auVar42;
                          auVar52._0_4_ = auVar54._0_4_ + auVar82._0_4_;
                          auVar52._4_4_ = auVar54._4_4_ + auVar82._4_4_;
                          auVar52._8_4_ = auVar54._8_4_ + auVar82._8_4_;
                          auVar54._12_4_ = auVar54._12_4_ + auVar82._12_4_;
                          auVar54._0_12_ = auVar52;
                          auVar65._0_4_ = auVar69._0_4_ + auVar88._0_4_;
                          auVar65._4_4_ = auVar69._4_4_ + auVar88._4_4_;
                          auVar65._8_4_ = auVar69._8_4_ + auVar88._8_4_;
                          auVar69._12_4_ = auVar69._12_4_ + auVar88._12_4_;
                          auVar69._0_12_ = auVar65;
                          auVar75._0_4_ = auVar78._0_4_ + auVar88._0_4_;
                          auVar75._4_4_ = auVar78._4_4_ + auVar88._4_4_;
                          auVar75._8_4_ = auVar78._8_4_ + auVar88._8_4_;
                          auVar78._12_4_ = auVar78._12_4_ + auVar88._12_4_;
                          auVar78._0_12_ = auVar75;
                          uVar19 = uVar19 + 1;
                        } while (iVar7 != (int)uVar19);
                      }
                    }
                    fVar27 = (float)((this->super_GridMesh).super_Geometry.numTimeSteps - 1);
                    uVar25 = (ulong)(uint)fVar27;
                    aVar45.m128[3] = (float)geomID;
                    aVar45._0_12_ = auVar42;
                    aVar70.m128[3] = (float)local_100;
                    aVar70._0_12_ = auVar65;
                    aVar55.m128[3] = fVar27;
                    aVar55._0_12_ = auVar52;
                    aVar79.m128[3] = fVar27;
                    aVar79._0_12_ = auVar75;
                    auVar38._0_4_ =
                         auVar65._0_4_ * 0.5 + auVar75._0_4_ * 0.5 +
                         auVar42._0_4_ * 0.5 + auVar52._0_4_ * 0.5;
                    auVar38._4_4_ =
                         auVar65._4_4_ * 0.5 + auVar75._4_4_ * 0.5 +
                         auVar42._4_4_ * 0.5 + auVar52._4_4_ * 0.5;
                    auVar38._8_4_ =
                         auVar65._8_4_ * 0.5 + auVar75._8_4_ * 0.5 +
                         auVar42._8_4_ * 0.5 + auVar52._8_4_ * 0.5;
                    auVar38._12_4_ =
                         (float)local_100 * 0.5 + fVar27 * 0.5 + (float)geomID * 0.5 + fVar27 * 0.5;
                    local_118 = local_118 + 1;
                    local_110 = local_110 + uVar25;
                    sVar29 = uVar25;
                    if (uVar25 < sVar28) {
                      sVar29 = sVar28;
                    }
                    uVar13 = uVar20 + 2;
                    aVar89.m128 = (__m128)minps(aVar89.m128,auVar38);
                    aVar83.m128 = (__m128)maxps(aVar83.m128,auVar38);
                    BVar91 = (this->super_GridMesh).super_Geometry.time_range;
                    local_a8.m128 = (__m128)minps(local_a8.m128,aVar45.m128);
                    sgrids->items[local_100] =
                         (SubGridBuildData)
                         ((ulong)(uVar20 & 0xfffe | (uint)(uVar90 <= uVar13) << 0xf) |
                         (ulong)(uVar8 << 0x10 | (uint)((uint)uVar2 <= uVar8 + 2) << 0x1f) |
                         uVar17 << 0x20);
                    pPVar4 = prims->items;
                    pPVar4[local_100].lbounds.bounds0.lower.field_0 = aVar45;
                    local_b8.m128 = (__m128)maxps(local_b8.m128,aVar70.m128);
                    pPVar4[local_100].lbounds.bounds0.upper.field_0 = aVar70;
                    aVar71.m128 = (__m128)minps(aVar71.m128,aVar55.m128);
                    pPVar4[local_100].lbounds.bounds1.lower.field_0 = aVar55;
                    aVar60.m128 = (__m128)maxps(aVar60.m128,aVar79.m128);
                    fVar27 = BVar91.lower;
                    if (fVar27 <= local_17c) {
                      local_17c = fVar27;
                    }
                    pPVar4[local_100].lbounds.bounds1.upper.field_0 = aVar79;
                    fVar35 = BVar91.upper;
                    pPVar4[local_100].time_range = BVar91;
                    auVar82._4_4_ = fVar35;
                    auVar82._0_4_ = fVar35;
                    auVar82._8_4_ = fVar35;
                    auVar82._12_4_ = fVar35;
                    if (fVar35 <= fVar39) {
                      auVar82._0_4_ = fVar39;
                    }
                    uVar90 = (int)((uint)(sVar28 < uVar25) << 0x1f) >> 0x1f;
                    uVar20 = (int)((uint)(sVar28 < uVar25) << 0x1f) >> 0x1f;
                    auVar46._0_4_ = (uint)fVar27 & uVar90;
                    auVar46._4_4_ = (uint)fVar35 & uVar20;
                    auVar46._8_8_ = 0;
                    local_48 = auVar95._0_4_;
                    uStack_44 = auVar95._4_4_;
                    uStack_40 = auVar95._8_4_;
                    uStack_3c = auVar95._12_4_;
                    auVar94._0_4_ = ~uVar90 & local_48;
                    auVar94._4_4_ = ~uVar20 & uStack_44;
                    auVar94._8_4_ = uStack_40;
                    auVar94._12_4_ = uStack_3c;
                    auVar95 = auVar94 | auVar46;
                    local_100 = local_100 + 1;
                    uVar90 = (uint)*(ushort *)(lVar16 + 8 + lVar21);
                    sVar28 = sVar29;
                    uVar20 = uVar13;
                  } while (uVar13 < uVar90 - 1);
                }
                local_148 = (ulong)(uVar8 + 2);
              } while (uVar8 + 2 < *(ushort *)(lVar16 + 10 + lVar21) - 1);
            }
          }
        }
      }
LAB_00ac6473:
      fVar27 = auVar82._0_4_;
      BVar91 = auVar95._0_8_;
      uVar17 = uVar17 + 1;
    } while (uVar17 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_118;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = local_a8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_b8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar71;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar60;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar89;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar83;
  (__return_storage_ptr__->time_range).lower = local_17c;
  (__return_storage_ptr__->time_range).upper = fVar27;
  __return_storage_ptr__->num_time_segments = local_110;
  __return_storage_ptr__->max_num_time_segments = sVar29;
  __return_storage_ptr__->max_time_range = BVar91;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }